

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::anon_unknown_15::anon_unknown_36::hexEscapeChar(ostream *os,uchar c)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  ostream *poVar4;
  undefined7 in_register_00000031;
  
  uVar1 = *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
  poVar4 = std::operator<<(os,"\\x");
  pp_Var2 = poVar4->_vptr_basic_ostream;
  *(uint *)(&poVar4->field_0x18 + (long)pp_Var2[-3]) =
       *(uint *)(&poVar4->field_0x18 + (long)pp_Var2[-3]) | 0x4000;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&poVar4->field_0x18 + (long)p_Var3) =
       *(uint *)(&poVar4->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  poVar4 = std::operator<<(poVar4,0x30);
  *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
  std::ostream::operator<<(poVar4,(int)CONCAT71(in_register_00000031,c));
  *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) = uVar1;
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }